

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_adjacency_subgraph.cpp
# Opt level: O0

void __thiscall
Adjacency_Subgraph_reorder_Test::Adjacency_Subgraph_reorder_Test
          (Adjacency_Subgraph_reorder_Test *this)

{
  Adjacency_Subgraph_reorder_Test *this_local;
  
  testing::Test::Test(&this->super_Test);
  (this->super_Test)._vptr_Test = (_func_int **)&PTR__Adjacency_Subgraph_reorder_Test_001df0e8;
  return;
}

Assistant:

TEST(Adjacency_Subgraph, reorder) {
  // Check empty graph calls
  Adjacency_Subgraph subgraph;
  EXPECT_NO_FATAL_FAILURE(subgraph.reorder(std::vector<std::size_t>()));
  EXPECT_DEATH(subgraph.reorder(std::vector<std::size_t>({0, 1})), "./*");

  Adjacency_Graph graph = create_graph_structured<false>(3);  // pentagon with diagonal connection.
  subgraph = Adjacency_Subgraph(graph, {4}, 1);
  subgraph.update_levels(graph, 2);

  // Check death conditions
  EXPECT_DEATH(subgraph.reorder(std::vector<std::size_t>({0, 1})), "./*");  // check under size crashes
  EXPECT_DEATH(subgraph.reorder(std::vector<std::size_t>({10, 9, 8, 7, 6, 5, 4, 3, 2, 1, 0})),
               "./*");  // check oversize crashes
  EXPECT_DEATH(subgraph.reorder(std::vector<std::size_t>({9, 8, 7, 6, 5, 4, 8, 2, 1, 0})),
               "./*");  // check duplicate crashes
  EXPECT_DEATH(subgraph.reorder(std::vector<std::size_t>({9, 8, 7, 6, 5, 4, 3, 10, 1, 0})),
               "./*");  // check index > size

  // Actual reordering check, needs to re-order and ensure sorted lists are created.
  //                         global index   4  1  3  5  7  0  2  6  8
  //                            old index   0  1  2  3  4  5  6  7  8
  std::vector<std::size_t> new_numbering = {4, 1, 3, 5, 7, 0, 2, 6, 8};
  Adjacency_Subgraph old_subgraph = subgraph.reorder(new_numbering);
  EXPECT_TRUE(subgraph.is_parent(graph));
  EXPECT_EQ(subgraph.size().first, 9);
  EXPECT_EQ(subgraph.size().second, 12);

  // 0 : 1, 2, 3, 4  -> 4 : 1, 3, 5, 7
  EXPECT_EQ(subgraph[4].size(), 4);
  EXPECT_EQ(subgraph[4][0], 1);
  EXPECT_EQ(subgraph[4][1], 3);
  EXPECT_EQ(subgraph[4][2], 5);
  EXPECT_EQ(subgraph[4][3], 7);
  EXPECT_EQ(subgraph.vertex_level(4), 0);
  EXPECT_EQ(subgraph.local_global(4), 4);

  // 1 : 0, 2, 4     -> 1 : 0, 2, 4
  EXPECT_EQ(subgraph[1].size(), 3);
  EXPECT_EQ(subgraph[1][0], 0);
  EXPECT_EQ(subgraph[1][1], 2);
  EXPECT_EQ(subgraph[1][2], 4);
  EXPECT_EQ(subgraph.vertex_level(1), 1);
  EXPECT_EQ(subgraph.local_global(1), 1);

  // 2 : 4, 5, 7     -> 3 : 0, 4, 6
  EXPECT_EQ(subgraph[3].size(), 3);
  EXPECT_EQ(subgraph[3][0], 0);
  EXPECT_EQ(subgraph[3][1], 4);
  EXPECT_EQ(subgraph[3][2], 6);
  EXPECT_EQ(subgraph.vertex_level(3), 1);
  EXPECT_EQ(subgraph.local_global(3), 3);

  // 3 : 6, 0, 8     -> 5 : 2, 4, 8
  EXPECT_EQ(subgraph[5].size(), 3);
  EXPECT_EQ(subgraph[5][0], 2);
  EXPECT_EQ(subgraph[5][1], 4);
  EXPECT_EQ(subgraph[5][2], 8);
  EXPECT_EQ(subgraph.vertex_level(5), 1);
  EXPECT_EQ(subgraph.local_global(5), 5);

  // 4 : 0, 7, 8     -> 7 : 4, 6, 8
  EXPECT_EQ(subgraph[7].size(), 3);
  EXPECT_EQ(subgraph[7][0], 4);
  EXPECT_EQ(subgraph[7][1], 6);
  EXPECT_EQ(subgraph[7][2], 8);
  EXPECT_EQ(subgraph.vertex_level(7), 1);
  EXPECT_EQ(subgraph.local_global(7), 7);

  // 5 : 1, 2        -> 0 : 1, 3
  EXPECT_EQ(subgraph[0].size(), 2);
  EXPECT_EQ(subgraph[0][0], 1);
  EXPECT_EQ(subgraph[0][1], 3);
  EXPECT_EQ(subgraph.vertex_level(0), 2);
  EXPECT_EQ(subgraph.local_global(0), 0);

  // 6 : 1, 3        -> 2 : 1, 5
  EXPECT_EQ(subgraph[2].size(), 2);
  EXPECT_EQ(subgraph[2][0], 1);
  EXPECT_EQ(subgraph[2][1], 5);
  EXPECT_EQ(subgraph.vertex_level(2), 2);
  EXPECT_EQ(subgraph.local_global(2), 2);

  // 7 : 2, 4         -> 6 : 3, 7
  EXPECT_EQ(subgraph[6].size(), 2);
  EXPECT_EQ(subgraph[6][0], 3);
  EXPECT_EQ(subgraph[6][1], 7);
  EXPECT_EQ(subgraph.vertex_level(6), 2);
  EXPECT_EQ(subgraph.local_global(6), 6);

  // 8 : 3, 4         -> 8 : 5, 7
  EXPECT_EQ(subgraph[8].size(), 2);
  EXPECT_EQ(subgraph[8][0], 5);
  EXPECT_EQ(subgraph[8][1], 7);
  EXPECT_EQ(subgraph.vertex_level(8), 2);
  EXPECT_EQ(subgraph.local_global(8), 8);
}